

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O2

bool __thiscall FC_BPNN::Forward(FC_BPNN *this)

{
  _Rb_tree_color _Var1;
  pointer pmVar2;
  pointer pvVar3;
  long lVar4;
  pointer pdVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  int j;
  ulong uVar8;
  ulong uVar9;
  
  uVar9 = 0;
  while( true ) {
    pmVar2 = (this->net).
             super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->net).
                       super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar2) / 0x30) <= uVar9)
    break;
    for (p_Var7 = *(_Base_ptr *)((long)&pmVar2[uVar9]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var7 != &pmVar2[uVar9]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      pvVar3 = (this->layers_value).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)&pvVar3[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl;
      pdVar5 = *(pointer *)
                ((long)&pvVar3[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl +
                8);
      for (uVar8 = 0; uVar8 < (ulong)((long)pdVar5 - lVar4 >> 3); uVar8 = uVar8 + 1) {
        *(undefined8 *)(&(p_Var7[1]._M_parent[3]._M_left)->_M_color + uVar8 * 2) =
             *(undefined8 *)(lVar4 + uVar8 * 8);
      }
      _Var1 = p_Var7[1]._M_color;
      plVar6 = (long *)__dynamic_cast(p_Var7[1]._M_parent,&Preceptron::typeinfo,
                                      &Preceptron_SIGMOID::typeinfo,0);
      (**(code **)(*plVar6 + 0x18))(plVar6);
      lVar4 = *(long *)&(this->layers_value).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9 + 1].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl;
      *(double *)(lVar4 + (ulong)_Var1 * 8) =
           (double)p_Var7[1]._M_parent[4]._M_parent + *(double *)(lVar4 + (ulong)_Var1 * 8);
    }
    uVar9 = uVar9 + 1;
  }
  return true;
}

Assistant:

bool FC_BPNN::Forward()
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			for (int j = 0; j < layers_value[i].size(); j++)
				element.second->input[j] = layers_value[i][j];
			size_t finder = element.first;
			size_t finder1 = finder & 0X00000000FFFFFFFF;
			dynamic_cast<Preceptron_SIGMOID*>(element.second)->Forward();
			layers_value[i + 1][finder1] += element.second->output;
		}
	}
	return true;
}